

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O1

int Abc_NtkCollectPiPos_rec(Abc_Obj_t *pNet,Vec_Ptr_t *vLiMaps,Vec_Ptr_t *vLoMaps)

{
  int iVar1;
  undefined4 uVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  long *plVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  int Fill;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar9;
  undefined8 extraout_RDX_01;
  int iVar10;
  long lVar11;
  Abc_Obj_t *pBox;
  
  if ((*(uint *)&pNet->field_0x14 & 0xf) != 6) {
    __assert_fail("Abc_ObjIsNet(pNet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                  ,0x61,"int Abc_NtkCollectPiPos_rec(Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  pAVar3 = pNet->pNtk;
  iVar7 = pNet->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar7 + 1,(int)vLoMaps);
  if (((long)iVar7 < 0) || ((pAVar3->vTravIds).nSize <= iVar7)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar4 = pNet->pNtk;
  iVar1 = pAVar4->nTravIds;
  iVar10 = 0;
  if ((pAVar3->vTravIds).pArray[iVar7] != iVar1) {
    iVar7 = pNet->Id;
    Vec_IntFillExtra(&pAVar4->vTravIds,iVar7 + 1,Fill);
    if (((long)iVar7 < 0) || ((pAVar4->vTravIds).nSize <= iVar7)) {
LAB_0083146e:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    (pAVar4->vTravIds).pArray[iVar7] = iVar1;
    pBox = (Abc_Obj_t *)pNet->pNtk->vObjs->pArray[*(pNet->vFanins).pArray];
    uVar9 = extraout_RDX;
    iVar10 = 0;
    if (((*(uint *)&pBox->field_0x14 & 0xf) == 7) && (iVar10 = 0, 0 < (pBox->vFanins).nSize)) {
      lVar11 = 0;
      iVar10 = 0;
      do {
        iVar7 = Abc_NtkCollectPiPos_rec
                          ((Abc_Obj_t *)pBox->pNtk->vObjs->pArray[(pBox->vFanins).pArray[lVar11]],
                           vLiMaps,vLoMaps);
        iVar10 = iVar10 + iVar7;
        lVar11 = lVar11 + 1;
        uVar9 = extraout_RDX_00;
      } while (lVar11 < (pBox->vFanins).nSize);
    }
    uVar8 = *(uint *)&pBox->field_0x14 & 0xf;
    if (uVar8 != 7) {
      if (uVar8 == 5) {
        pBox = (Abc_Obj_t *)pBox->pNtk->vObjs->pArray[*(pBox->vFanins).pArray];
      }
      if ((*(uint *)&pBox->field_0x14 & 0xe) != 8 && (*(uint *)&pBox->field_0x14 & 0xf) != 10) {
        __assert_fail("Abc_ObjIsBox(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcBarBuf.c"
                      ,0x6d,"int Abc_NtkCollectPiPos_rec(Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
      }
      if (0 < (pBox->vFanouts).nSize) {
        lVar11 = 0;
        do {
          plVar5 = (long *)pBox->pNtk->vObjs->pArray[(pBox->vFanouts).pArray[lVar11]];
          plVar5 = *(long **)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)*(int *)plVar5[6] * 8
                             );
          lVar6 = *plVar5;
          uVar2 = *(undefined4 *)(lVar6 + 0xd8);
          iVar7 = (int)plVar5[2];
          Vec_IntFillExtra((Vec_Int_t *)(lVar6 + 0xe0),iVar7 + 1,(int)uVar9);
          if (((long)iVar7 < 0) || (*(int *)(lVar6 + 0xe4) <= iVar7)) goto LAB_0083146e;
          *(undefined4 *)(*(long *)(lVar6 + 0xe8) + (long)iVar7 * 4) = uVar2;
          lVar11 = lVar11 + 1;
          uVar9 = extraout_RDX_01;
        } while (lVar11 < (pBox->vFanouts).nSize);
      }
      if (0 < (pBox->vFanins).nSize) {
        lVar11 = 0;
        do {
          plVar5 = (long *)pBox->pNtk->vObjs->pArray[(pBox->vFanins).pArray[lVar11]];
          iVar7 = Abc_NtkCollectPiPos_rec
                            (*(Abc_Obj_t **)
                              (*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                              (long)*(int *)plVar5[4] * 8),vLiMaps,vLoMaps);
          iVar10 = iVar10 + iVar7;
          lVar11 = lVar11 + 1;
        } while (lVar11 < (pBox->vFanins).nSize);
      }
      if ((*(uint *)&pBox->field_0x14 & 0xf) != 9) {
        __assert_fail("pObj->Type == ABC_OBJ_WHITEBOX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                      ,0x151,"Abc_Ntk_t *Abc_ObjModel(Abc_Obj_t *)");
      }
      iVar7 = Abc_NtkCollectPiPos_int(pBox,(Abc_Ntk_t *)(pBox->field_5).pData,vLiMaps,vLoMaps);
      iVar10 = iVar10 + iVar7;
    }
  }
  return iVar10;
}

Assistant:

int Abc_NtkCollectPiPos_rec( Abc_Obj_t * pNet, Vec_Ptr_t * vLiMaps, Vec_Ptr_t * vLoMaps )
{
    extern int Abc_NtkCollectPiPos_int( Abc_Obj_t * pBox, Abc_Ntk_t * pNtk, Vec_Ptr_t * vLiMaps, Vec_Ptr_t * vLoMaps );
    Abc_Obj_t * pObj, * pFanin; 
    int i, Counter = 0;
    assert( Abc_ObjIsNet(pNet) );
    if ( Abc_NodeIsTravIdCurrent( pNet ) )
        return 0;
    Abc_NodeSetTravIdCurrent( pNet );
    pObj = Abc_ObjFanin0(pNet);
    if ( Abc_ObjIsNode(pObj) )
        Abc_ObjForEachFanin( pObj, pFanin, i )
            Counter += Abc_NtkCollectPiPos_rec( pFanin, vLiMaps, vLoMaps );
    if ( Abc_ObjIsNode(pObj) )
        return Counter;
    if ( Abc_ObjIsBo(pObj) )
        pObj = Abc_ObjFanin0(pObj);
    assert( Abc_ObjIsBox(pObj) );
    Abc_ObjForEachFanout( pObj, pFanin, i )
        Abc_NodeSetTravIdCurrent( Abc_ObjFanout0(pFanin) );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Counter += Abc_NtkCollectPiPos_rec( Abc_ObjFanin0(pFanin), vLiMaps, vLoMaps );
    Counter += Abc_NtkCollectPiPos_int( pObj, Abc_ObjModel(pObj), vLiMaps, vLoMaps );
    return Counter;
}